

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::dec_writer>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::dec_writer>
          *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  char8_t *__s;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  char8_t *local_48;
  ulong local_40;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::dec_writer>
  *local_38;
  
  local_40 = (ulong)spec->width_;
  uVar5 = f->size_;
  __n = local_40 - uVar5;
  if (local_40 < uVar5 || __n == 0) {
    puVar2 = *(undefined8 **)this;
    lVar3 = puVar2[2];
    uVar5 = uVar5 + lVar3;
    if ((ulong)puVar2[3] < uVar5) {
      (**(code **)*puVar2)(puVar2,uVar5);
    }
    puVar2[2] = uVar5;
    local_48 = (char8_t *)(lVar3 + puVar2[1]);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::dec_writer>
                  *)f,&local_48);
    return;
  }
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  uVar4 = lVar3 + local_40;
  local_38 = f;
  if ((ulong)puVar2[3] < uVar4) {
    (**(code **)*puVar2)(puVar2,uVar4);
  }
  puVar2[2] = uVar4;
  __s = (char8_t *)(lVar3 + puVar2[1]);
  bVar1 = (byte)spec->fill_;
  local_48 = __s;
  if (spec->align_ == ALIGN_CENTER) {
    uVar4 = __n >> 1;
    if (1 < __n) {
      memset(__s,(uint)bVar1,uVar4);
      __s = __s + uVar4;
    }
    local_48 = __s;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::dec_writer>
                  *)local_38,&local_48);
    if (local_40 == uVar5) {
      return;
    }
    __n = __n - uVar4;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      if (local_40 != uVar5) {
        memset(__s,(uint)bVar1,__n);
        __s = __s + __n;
      }
      local_48 = __s;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::dec_writer>
                    *)local_38,&local_48);
      return;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::dec_writer>
                  *)local_38,&local_48);
    if (local_40 == uVar5) {
      return;
    }
  }
  memset(local_48,(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }